

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O2

Iff_Man_t *
Gia_ManIffPerform(Gia_Man_t *pGia,If_LibLut_t *pLib,Tim_Man_t *pTime,int nLutSize,int nDegree)

{
  int iVar1;
  int iVar2;
  Iff_Man_t *p;
  Gia_Obj_t *pObj;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int v;
  float fVar6;
  float DelayMin;
  float local_6c;
  int iFanin;
  ulong local_58;
  float local_50;
  int local_4c;
  int iFanin2;
  int iFanin1;
  Tim_Man_t *local_40;
  float (*local_38) [33];
  
  if ((nDegree & 0xfffffffeU) != 2) {
    __assert_fail("nDegree == 2 || nDegree == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                  ,0xe9,
                  "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)")
    ;
  }
  p = Gia_ManIffStart(pGia);
  p->pGia = pGia;
  p->pLib = pLib;
  p->nLutSize = nLutSize;
  p->nDegree = nDegree;
  iVar2 = 0;
  local_4c = nDegree;
  Iff_ObjSetTimeId(p,0,0.0);
  local_40 = pTime;
  Tim_ManIncrementTravId(pTime);
  local_38 = pLib->pLutDelays;
  local_6c = -1e+09;
  v = 1;
  local_58 = 0;
  iVar5 = 0;
  do {
    if ((pGia->nObjs <= v) || (pObj = Gia_ManObj(pGia,v), pObj == (Gia_Obj_t *)0x0)) {
      printf("Max delay = %.2f.  Count1 = %d.  Count2 = %d.  Count3 = %d.\n",(double)local_6c,
             (ulong)(uint)((iVar5 - (int)local_58) - iVar2));
      return p;
    }
    uVar4 = (uint)*(ulong *)pObj;
    uVar3 = *(ulong *)pObj & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar4 < 0) {
      if ((~uVar4 & 0x9fffffff) == 0) {
        iVar1 = Gia_ObjCioId(pObj);
        fVar6 = Tim_ManGetCiArrival(local_40,iVar1);
        Iff_ObjSetTime(p,pObj,fVar6);
      }
      else {
        if ((-1 < (int)uVar4) || ((int)uVar3 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                        ,0x125,
                        "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                       );
        }
        iVar1 = Gia_ObjFaninId0p(pGia,pObj);
        fVar6 = Iff_ObjTimeId(p,iVar1);
        iVar1 = Gia_ObjCioId(pObj);
        Tim_ManSetCoArrival(local_40,iVar1,fVar6);
        Iff_ObjSetTime(p,pObj,fVar6);
        if (local_6c <= fVar6) {
          local_6c = fVar6;
        }
      }
    }
    else {
      iVar1 = Gia_ObjIsLut(pGia,v);
      if (iVar1 != 0) {
        iVar5 = iVar5 + 1;
        fVar6 = Gia_IffObjTimeOne(p,v,-1,-1);
        iVar1 = Gia_ObjLutSize(pGia,v);
        fVar6 = fVar6 + local_38[iVar1][0];
        DelayMin = Gia_IffObjTimeTwo(p,v,&iFanin,fVar6);
        if (local_4c == 3) {
          local_50 = Gia_IffObjTimeThree(p,v,&iFanin1,&iFanin2,DelayMin);
          Iff_ObjSetTimeId(p,v,local_50);
          if ((local_50 != fVar6) || (NAN(local_50) || NAN(fVar6))) {
            if ((local_50 == DelayMin) && (!NAN(local_50) && !NAN(DelayMin))) goto LAB_005acebd;
            if (DelayMin <= local_50) {
              __assert_fail("arrTime3 < arrTime2",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                            ,0x112,
                            "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                           );
            }
            Iff_ObjSetMatchId(p,v,2,iFanin1);
            Iff_ObjSetMatchId(p,v,3,iFanin2);
            local_58 = (ulong)((int)local_58 + 1);
          }
        }
        else {
          if (local_4c != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                          ,0x117,
                          "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                         );
          }
          Iff_ObjSetTimeId(p,v,DelayMin);
          if (DelayMin < fVar6) {
LAB_005acebd:
            Iff_ObjSetMatchId(p,v,2,iFanin);
            iVar2 = iVar2 + 1;
          }
        }
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

Iff_Man_t * Gia_ManIffPerform( Gia_Man_t * pGia, If_LibLut_t * pLib, Tim_Man_t * pTime, int nLutSize, int nDegree )
{
    Iff_Man_t * p;
    Gia_Obj_t * pObj;
    int iObj, iFanin, iFanin1, iFanin2;
    int CountAll = 0, Count2 = 0, Count3 = 0;
    float arrTime1, arrTime2, arrTime3, arrMax = -ABC_INFINITY; 
    assert( nDegree == 2 || nDegree == 3 );
    // start the mapping manager and set its parameters
    p = Gia_ManIffStart( pGia );
    p->pGia     = pGia;
    p->pLib     = pLib;
    p->nLutSize = nLutSize;
    p->nDegree  = nDegree;
    // compute arrival times of each node
    Iff_ObjSetTimeId( p, 0, 0 );
    Tim_ManIncrementTravId( pTime );
    Gia_ManForEachObj1( pGia, pObj, iObj )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( !Gia_ObjIsLut(pGia, iObj) )
                continue;
            CountAll++;
            // compute arrival times of LUT inputs
            arrTime1 = Gia_IffObjTimeOne( p, iObj, -1, -1 );
            arrTime1 += p->pLib->pLutDelays[Gia_ObjLutSize(pGia, iObj)][0];
            // compute arrival times of LUT pairs
            arrTime2 = Gia_IffObjTimeTwo( p, iObj, &iFanin, arrTime1 );
            if ( nDegree == 2 )
            {
                // set arrival times
                Iff_ObjSetTimeId( p, iObj, arrTime2 );
                if ( arrTime2 < arrTime1 )
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin ), Count2++;                
            }
            else if ( nDegree == 3 )
            {                
                // compute arrival times of LUT triples
                arrTime3 = Gia_IffObjTimeThree( p, iObj, &iFanin1, &iFanin2, arrTime2 );
                // set arrival times
                Iff_ObjSetTimeId( p, iObj, arrTime3 );
                if ( arrTime3 == arrTime1 )
                    continue;
                if ( arrTime3 == arrTime2 )
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin ), Count2++;
                else
                {
                    assert( arrTime3 < arrTime2 );
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin1 );
                    Iff_ObjSetMatchId( p, iObj, 3, iFanin2 ), Count3++;
                }
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            arrTime1 = Tim_ManGetCiArrival( pTime, Gia_ObjCioId(pObj) );
            Iff_ObjSetTime( p, pObj, arrTime1 );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            arrTime1 = Iff_ObjTimeId( p, Gia_ObjFaninId0p(pGia, pObj) );
            Tim_ManSetCoArrival( pTime, Gia_ObjCioId(pObj), arrTime1 );
            Iff_ObjSetTime( p, pObj, arrTime1 );
            arrMax = Abc_MaxFloat( arrMax, arrTime1 );
        }
        else assert( 0 );
    }
    printf( "Max delay = %.2f.  Count1 = %d.  Count2 = %d.  Count3 = %d.\n", 
        arrMax, CountAll - Count2 - Count3, Count2, Count3 );
    return p;
}